

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

duckdb_state duckdb_query_arrow(duckdb_connection connection,char *query,duckdb_arrow *out_result)

{
  __uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
  _Var1;
  undefined1 auVar2 [8];
  bool bVar3;
  duckdb_arrow this;
  pointer this_00;
  allocator local_51;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this = (duckdb_arrow)operator_new(0x10);
  *(tuple<duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
    *)this = (tuple<duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
              )0x0;
  *(tuple<duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
    *)(this + 8) =
       (tuple<duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
        )0x0;
  std::__cxx11::string::string((string *)&local_48,query,&local_51);
  duckdb::Connection::Query((Connection *)local_50,(string *)connection);
  auVar2 = local_50;
  local_50 = (undefined1  [8])0x0;
  _Var1.
  super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
  .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
       *(__uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
         *)this;
  *(undefined1 (*) [8])this = auVar2;
  if (_Var1.
      super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
      .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl !=
      (tuple<duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
       )0x0) {
    (**(code **)(*(long *)_Var1.
                          super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
                          .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>.
                          _M_head_impl + 8))();
  }
  if (local_50 != (undefined1  [8])0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((((enable_shared_from_this<duckdb::ClientContext> *)local_50)->__weak_this_)
                        .internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->
              _M_pi)();
  }
  local_50 = (undefined1  [8])0x0;
  if (local_48._M_pi != &local_38) {
    operator_delete(local_48._M_pi);
  }
  *out_result = this;
  this_00 = duckdb::
            unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
            ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                          *)this);
  bVar3 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)this_00);
  return (duckdb_state)bVar3;
}

Assistant:

duckdb_state duckdb_query_arrow(duckdb_connection connection, const char *query, duckdb_arrow *out_result) {
	Connection *conn = (Connection *)connection;
	auto wrapper = new ArrowResultWrapper();
	wrapper->result = conn->Query(query);
	*out_result = (duckdb_arrow)wrapper;
	return !wrapper->result->HasError() ? DuckDBSuccess : DuckDBError;
}